

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::addData(SymbolData *this,int64_t address,size_t size,DataType type)

{
  reference pvVar1;
  undefined1 local_40 [8];
  SymDataData data;
  DataType type_local;
  size_t size_local;
  int64_t address_local;
  SymbolData *this_local;
  
  if ((this->enabled & 1U) != 0) {
    local_40 = (undefined1  [8])address;
    data.address = size;
    data.size._0_4_ = type;
    data._20_4_ = type;
    pvVar1 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                       (&this->modules,(long)this->currentModule);
    std::set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_>::insert
              (&pvVar1->data,(value_type *)local_40);
  }
  return;
}

Assistant:

void SymbolData::addData(int64_t address, size_t size, DataType type)
{
	if (!enabled)
		return;

	SymDataData data;
	data.address = address;
	data.size = size;
	data.type = type;
	modules[currentModule].data.insert(data);
}